

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O1

err_t stb99SeedVal(stb99_seed *seed)

{
  size_t r;
  bool_t bVar1;
  err_t eVar2;
  ushort uVar3;
  long lVar4;
  size_t *psVar5;
  
  bVar1 = memIsValid(seed,0x128);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    psVar5 = _ls;
    lVar4 = 0;
    do {
      if (*psVar5 == seed->l) goto LAB_00143271;
      lVar4 = lVar4 + 1;
      psVar5 = psVar5 + 1;
    } while (lVar4 != 10);
    lVar4 = 10;
LAB_00143271:
    eVar2 = 0x20c;
    if (lVar4 != 10) {
      r = _rs[lVar4];
      lVar4 = 4;
      do {
        uVar3 = seed->zi[lVar4 + -4] - 1;
        if (0xfee7 < uVar3) {
          eVar2 = 0x20c;
          goto LAB_001432b6;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x23);
      eVar2 = 0;
LAB_001432b6:
      if (uVar3 < 0xfee8) {
        eVar2 = stb99DiVal(seed,r);
        if (eVar2 == 0) {
          eVar2 = stb99RiVal(seed,r);
          return eVar2;
        }
      }
    }
  }
  return eVar2;
}

Assistant:

err_t stb99SeedVal(const stb99_seed* seed)
{
	err_t code;
	size_t i;
	size_t r;
	// проверить указатели
	if (!memIsValid(seed, sizeof(stb99_seed)))
		return ERR_BAD_INPUT;
	// проверить l
	for (i = 0; i < COUNT_OF(_ls); ++i)
		if (_ls[i] == seed->l)
			break;
	if (i == COUNT_OF(_ls))
		return ERR_BAD_SEED;
	// определить r = r(l)
	r = _rs[i];
	// проверить числа zi
	code = stb99ZiVal(seed);
	ERR_CALL_CHECK(code);
	// проверить цепочку di
	code = stb99DiVal(seed, r);
	ERR_CALL_CHECK(code);
	// проверить цепочку ri
	code = stb99RiVal(seed, r);
	ERR_CALL_CHECK(code);
	// все хорошо
	return ERR_OK;
}